

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

size_t drwav_read_raw(drwav *pWav,size_t bytesToRead,void *pBufferOut)

{
  drwav_bool32 dVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  size_t bytesToSeek;
  drwav_uint8 buffer [4096];
  
  if (bytesToRead == 0 || pWav == (drwav *)0x0) {
    sVar2 = 0;
  }
  else {
    if (pWav->bytesRemaining < bytesToRead) {
      bytesToRead = pWav->bytesRemaining;
    }
    if (pBufferOut == (void *)0x0) {
      uVar4 = 0;
      do {
        sVar2 = uVar4;
        uVar4 = bytesToRead - sVar2;
        if (bytesToRead < sVar2 || uVar4 == 0) break;
        if (0x7ffffffe < uVar4) {
          uVar4 = 0x7fffffff;
        }
        dVar1 = (*pWav->onSeek)(pWav->pUserData,(int)uVar4,drwav_seek_origin_current);
        uVar4 = uVar4 + sVar2;
      } while (dVar1 != 0);
      do {
        uVar4 = bytesToRead - sVar2;
        if (bytesToRead < sVar2 || uVar4 == 0) break;
        if (0xfff < uVar4) {
          uVar4 = 0x1000;
        }
        sVar3 = (*pWav->onRead)(pWav->pUserData,buffer,uVar4);
        sVar2 = sVar2 + sVar3;
      } while (uVar4 <= sVar3);
    }
    else {
      sVar2 = (*pWav->onRead)(pWav->pUserData,pBufferOut,bytesToRead);
    }
    pWav->bytesRemaining = pWav->bytesRemaining - sVar2;
  }
  return sVar2;
}

Assistant:

DRWAV_API size_t drwav_read_raw(drwav* pWav, size_t bytesToRead, void* pBufferOut)
{
    size_t bytesRead;

    if (pWav == NULL || bytesToRead == 0) {
        return 0;
    }

    if (bytesToRead > pWav->bytesRemaining) {
        bytesToRead = (size_t)pWav->bytesRemaining;
    }

    if (pBufferOut != NULL) {
        bytesRead = pWav->onRead(pWav->pUserData, pBufferOut, bytesToRead);
    } else {
        /* We need to seek. If we fail, we need to read-and-discard to make sure we get a good byte count. */
        bytesRead = 0;
        while (bytesRead < bytesToRead) {
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > 0x7FFFFFFF) {
                bytesToSeek = 0x7FFFFFFF;
            }

            if (pWav->onSeek(pWav->pUserData, (int)bytesToSeek, drwav_seek_origin_current) == DRWAV_FALSE) {
                break;
            }

            bytesRead += bytesToSeek;
        }

        /* When we get here we may need to read-and-discard some data. */
        while (bytesRead < bytesToRead) {
            drwav_uint8 buffer[4096];
            size_t bytesSeeked;
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > sizeof(buffer)) {
                bytesToSeek = sizeof(buffer);
            }

            bytesSeeked = pWav->onRead(pWav->pUserData, buffer, bytesToSeek);
            bytesRead += bytesSeeked;

            if (bytesSeeked < bytesToSeek) {
                break;  /* Reached the end. */
            }
        }
    }

    pWav->bytesRemaining -= bytesRead;
    return bytesRead;
}